

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OrderParameterProbZ.cpp
# Opt level: O2

void __thiscall OpenMD::OrderParameterProbZ::writeOrderCount(OrderParameterProbZ *this)

{
  pointer pdVar1;
  char cVar2;
  ostream *poVar3;
  long lVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  undefined1 auVar8 [16];
  double dVar9;
  ofstream rdfStream;
  
  std::ofstream::ofstream
            (&rdfStream,(this->super_StaticAnalyser).outputFilename_._M_dataplus._M_p,_S_out);
  cVar2 = std::__basic_file<char>::is_open();
  if (cVar2 == '\0') {
    snprintf(painCave.errMsg,2000,"OrderProb: unable to open %s\n",
             (this->super_StaticAnalyser).outputFilename_._M_dataplus._M_p);
    painCave.isFatal = 1;
    simError();
  }
  else {
    poVar3 = std::operator<<((ostream *)&rdfStream,"#Order count probablity ");
    std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<((ostream *)&rdfStream,"#selection: (");
    poVar3 = std::operator<<(poVar3,(string *)&this->selectionScript_);
    std::operator<<(poVar3,")\n");
    poVar3 = std::operator<<((ostream *)&rdfStream,"# Prefered Axis:");
    poVar3 = std::operator<<(poVar3,(string *)&this->axisLabel_);
    std::operator<<(poVar3,"\n##Order\tProbOrderCount\n");
    uVar6 = 0;
    while( true ) {
      uVar7 = (ulong)uVar6;
      pdVar1 = (this->Count_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar4 = (long)(this->Count_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)pdVar1;
      uVar5 = lVar4 >> 3;
      if (uVar5 <= uVar7) break;
      auVar8._8_4_ = (int)(lVar4 >> 0x23);
      auVar8._0_8_ = uVar5;
      auVar8._12_4_ = 0x45300000;
      dVar9 = pdVar1[uVar7];
      if (this->totalCount_ != 0) {
        dVar9 = dVar9 / (double)this->totalCount_;
      }
      poVar3 = std::ostream::_M_insert<double>
                         ((2.0 / ((auVar8._8_8_ - 1.9342813113834067e+25) +
                                 ((double)CONCAT44(0x43300000,(int)uVar5) - 4503599627370496.0))) *
                          (double)uVar7);
      std::operator<<(poVar3,"\t");
      poVar3 = std::ostream::_M_insert<double>(dVar9);
      std::operator<<(poVar3,"\n");
      uVar6 = uVar6 + 1;
    }
  }
  std::ofstream::close();
  std::ofstream::~ofstream(&rdfStream);
  return;
}

Assistant:

void OrderParameterProbZ::writeOrderCount() {
    std::ofstream rdfStream(outputFilename_.c_str());
    if (rdfStream.is_open()) {
      rdfStream << "#Order count probablity "
                << "\n";
      rdfStream << "#selection: (" << selectionScript_ << ")\n";
      rdfStream << "# Prefered Axis:" << axisLabel_
                << "\n##Order\tProbOrderCount\n";
      for (unsigned int i = 0; i < Count_.size(); ++i) {
        RealType order = i * (2.0 / Count_.size());
        RealType prop;
        if (totalCount_ == 0)
          prop = Count_[i];
        else
          prop = Count_[i] / totalCount_;
        rdfStream << order << "\t" << prop << "\n";
      }

    } else {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "OrderProb: unable to open %s\n", outputFilename_.c_str());
      painCave.isFatal = 1;
      simError();
    }

    rdfStream.close();
  }